

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void ScalePlaneBilinearUp
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  void *__ptr;
  ulong uVar5;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int yf;
  int lasty;
  int rowstride;
  uint8_t *rowptr;
  uint8_t *row;
  uint8_t *row_mem;
  int kRowSize;
  uint8_t *src;
  int yi;
  _func_void_uint8_t_ptr_uint8_t_ptr_int_int_int *ScaleFilterCols;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int max_y;
  int dy;
  int dx;
  int y;
  int x;
  int j;
  int test_flag;
  FilterMode in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffb0;
  int local_44;
  code *local_40;
  code *local_38;
  undefined4 local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  int local_8;
  int local_4;
  
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  iVar1 = (in_ESI + -1) * 0x10000;
  local_38 = InterpolateRow_C;
  if (in_stack_00000018 == 0) {
    local_40 = ScaleCols_C;
  }
  else {
    local_40 = ScaleFilterCols_C;
  }
  local_18 = in_R9D;
  local_14 = in_R8D;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  ScaleSlope((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             (int *)local_40,in_stack_ffffffffffffffa0,
             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffb0);
  local_4 = libyuv::Abs(local_4);
  test_flag = (int)((ulong)&local_28 >> 0x20);
  iVar2 = libyuv::TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (local_38 = InterpolateRow_Any_SSSE3, (local_c & 0xf) == 0)) {
    local_38 = InterpolateRow_SSSE3;
  }
  iVar2 = libyuv::TestCpuFlag(test_flag);
  if ((iVar2 != 0) && (local_38 = InterpolateRow_Any_AVX2, (local_c & 0x1f) == 0)) {
    local_38 = InterpolateRow_AVX2;
  }
  if ((in_stack_00000018 != 0) && (0x7fff < local_4)) {
    local_40 = ScaleFilterCols64_C;
  }
  if (((in_stack_00000018 != 0) && (iVar2 = libyuv::TestCpuFlag(test_flag), iVar2 != 0)) &&
     (local_4 < 0x8000)) {
    local_40 = ScaleFilterCols_SSSE3;
  }
  if (((in_stack_00000018 == 0) && (local_4 << 1 == local_c)) && (local_20 < 0x8000)) {
    local_40 = ScaleColsUp2_C;
  }
  if (iVar1 < local_24) {
    local_24 = iVar1;
  }
  iVar2 = local_24 >> 0x10;
  lVar4 = in_stack_00000008 + iVar2 * local_14;
  uVar3 = local_c + 0x1f & 0xffffffe0;
  __ptr = malloc((long)(int)(uVar3 * 2 + 0x3f));
  uVar5 = (long)__ptr + 0x3fU & 0xffffffffffffffc0;
  (*local_40)(uVar5,lVar4,local_c,local_20,local_28);
  if (1 < local_8) {
    lVar4 = lVar4 + local_14;
  }
  (*local_40)(uVar5 + (long)(int)uVar3,lVar4,local_c,local_20,local_28);
  lVar4 = lVar4 + local_14;
  for (local_1c = 0; local_1c < local_10; local_1c = local_1c + 1) {
    local_44 = local_24 >> 0x10;
    if (local_44 != iVar2) {
      if (iVar1 < local_24) {
        local_44 = iVar1 >> 0x10;
        lVar4 = in_stack_00000008 + local_44 * local_14;
        local_24 = iVar1;
      }
      if (local_44 != iVar2) {
        (*local_40)(uVar5,lVar4,local_c,local_20,local_28);
        uVar5 = uVar5 + (long)(int)uVar3;
        uVar3 = -uVar3;
        lVar4 = lVar4 + local_14;
        iVar2 = local_44;
      }
    }
    if (in_stack_00000018 == 1) {
      (*local_38)(in_stack_00000010,uVar5,0,local_c,0);
    }
    else {
      (*local_38)(in_stack_00000010,uVar5,(long)(int)uVar3,local_c,local_24 >> 8 & 0xff);
    }
    in_stack_00000010 = in_stack_00000010 + local_18;
  }
  free(__ptr);
  return;
}

Assistant:

void ScalePlaneBilinearUp(int src_width,
                          int src_height,
                          int dst_width,
                          int dst_height,
                          int src_stride,
                          int dst_stride,
                          const uint8_t* src_ptr,
                          uint8_t* dst_ptr,
                          enum FilterMode filtering) {
  int j;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height - 1) << 16;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  void (*ScaleFilterCols)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                          int dst_width, int x, int dx) =
      filtering ? ScaleFilterCols_C : ScaleCols_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif

  if (filtering && src_width >= 32768) {
    ScaleFilterCols = ScaleFilterCols64_C;
  }
#if defined(HAS_SCALEFILTERCOLS_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_NEON)
  if (filtering && TestCpuFlag(kCpuHasNEON) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_MSA)
  if (filtering && TestCpuFlag(kCpuHasMSA) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleFilterCols = ScaleFilterCols_MSA;
    }
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleFilterCols = ScaleColsUp2_C;
#if defined(HAS_SCALECOLS_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }
  {
    int yi = y >> 16;
    const uint8_t* src = src_ptr + yi * src_stride;

    // Allocate 2 row buffers.
    const int kRowSize = (dst_width + 31) & ~31;
    align_buffer_64(row, kRowSize * 2);

    uint8_t* rowptr = row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_ptr + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_ptr, rowptr, 0, dst_width, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_ptr, rowptr, rowstride, dst_width, yf);
      }
      dst_ptr += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}